

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void update_retrig(DUMB_IT_SIGRENDERER *sigrenderer,IT_CHANNEL *channel)

{
  long in_RSI;
  long *in_RDI;
  IT_PLAYING *unaff_retaddr;
  IT_CHANNEL *in_stack_00000048;
  DUMB_IT_SIGRENDERER *in_stack_00000050;
  int32 pos;
  
  pos = (int32)((ulong)in_RDI >> 0x20);
  if (*(char *)(in_RSI + 0x39) == '\0') {
    if (((*(byte *)(in_RSI + 0x38) & 0xf) != 0) &&
       (*(int *)(in_RSI + 0x3c) = *(int *)(in_RSI + 0x3c) + -1, *(int *)(in_RSI + 0x3c) < 1)) {
      if (0xf < *(byte *)(in_RSI + 0x38)) {
        if (*(byte *)(in_RSI + 0x38) < 0x20) {
          *(char *)(in_RSI + 4) = *(char *)(in_RSI + 4) + -1;
          if (0x40 < *(byte *)(in_RSI + 4)) {
            *(undefined1 *)(in_RSI + 4) = 0;
          }
        }
        else if (*(byte *)(in_RSI + 0x38) < 0x30) {
          *(char *)(in_RSI + 4) = *(char *)(in_RSI + 4) + -2;
          if (0x40 < *(byte *)(in_RSI + 4)) {
            *(undefined1 *)(in_RSI + 4) = 0;
          }
        }
        else if (*(byte *)(in_RSI + 0x38) < 0x40) {
          *(char *)(in_RSI + 4) = *(char *)(in_RSI + 4) + -4;
          if (0x40 < *(byte *)(in_RSI + 4)) {
            *(undefined1 *)(in_RSI + 4) = 0;
          }
        }
        else if (*(byte *)(in_RSI + 0x38) < 0x50) {
          *(char *)(in_RSI + 4) = *(char *)(in_RSI + 4) + -8;
          if (0x40 < *(byte *)(in_RSI + 4)) {
            *(undefined1 *)(in_RSI + 4) = 0;
          }
        }
        else if (*(byte *)(in_RSI + 0x38) < 0x60) {
          *(char *)(in_RSI + 4) = *(char *)(in_RSI + 4) + -0x10;
          if (0x40 < *(byte *)(in_RSI + 4)) {
            *(undefined1 *)(in_RSI + 4) = 0;
          }
        }
        else if (*(byte *)(in_RSI + 0x38) < 0x70) {
          *(char *)(in_RSI + 4) = *(char *)(in_RSI + 4) << 1;
          *(byte *)(in_RSI + 4) = *(byte *)(in_RSI + 4) / 3;
        }
        else if (*(byte *)(in_RSI + 0x38) < 0x80) {
          *(char *)(in_RSI + 4) = (char)((int)(uint)*(byte *)(in_RSI + 4) >> 1);
        }
        else if (0x8f < *(byte *)(in_RSI + 0x38)) {
          if (*(byte *)(in_RSI + 0x38) < 0xa0) {
            *(char *)(in_RSI + 4) = *(char *)(in_RSI + 4) + '\x01';
            if (0x40 < *(byte *)(in_RSI + 4)) {
              *(undefined1 *)(in_RSI + 4) = 0x40;
            }
          }
          else if (*(byte *)(in_RSI + 0x38) < 0xb0) {
            *(char *)(in_RSI + 4) = *(char *)(in_RSI + 4) + '\x02';
            if (0x40 < *(byte *)(in_RSI + 4)) {
              *(undefined1 *)(in_RSI + 4) = 0x40;
            }
          }
          else if (*(byte *)(in_RSI + 0x38) < 0xc0) {
            *(char *)(in_RSI + 4) = *(char *)(in_RSI + 4) + '\x04';
            if (0x40 < *(byte *)(in_RSI + 4)) {
              *(undefined1 *)(in_RSI + 4) = 0x40;
            }
          }
          else if (*(byte *)(in_RSI + 0x38) < 0xd0) {
            *(char *)(in_RSI + 4) = *(char *)(in_RSI + 4) + '\b';
            if (0x40 < *(byte *)(in_RSI + 4)) {
              *(undefined1 *)(in_RSI + 4) = 0x40;
            }
          }
          else if (*(byte *)(in_RSI + 0x38) < 0xe0) {
            *(char *)(in_RSI + 4) = *(char *)(in_RSI + 4) + '\x10';
            if (0x40 < *(byte *)(in_RSI + 4)) {
              *(undefined1 *)(in_RSI + 4) = 0x40;
            }
          }
          else if (*(byte *)(in_RSI + 0x38) < 0xf0) {
            *(char *)(in_RSI + 4) = *(char *)(in_RSI + 4) * '\x03';
            *(char *)(in_RSI + 4) = (char)((int)(uint)*(byte *)(in_RSI + 4) >> 1);
            if (0x40 < *(byte *)(in_RSI + 4)) {
              *(undefined1 *)(in_RSI + 4) = 0x40;
            }
          }
          else {
            *(char *)(in_RSI + 4) = *(char *)(in_RSI + 4) << 1;
            if (0x40 < *(byte *)(in_RSI + 4)) {
              *(undefined1 *)(in_RSI + 4) = 0x40;
            }
          }
        }
      }
      if (*(long *)(in_RSI + 0x88) == 0) {
        if ((*(uint *)(*in_RDI + 100) & 0x40) != 0) {
          it_retrigger_note(in_stack_00000050,in_stack_00000048);
        }
      }
      else {
        it_playing_reset_resamplers(unaff_retaddr,pos);
        *(undefined1 *)(*(long *)(in_RSI + 0x88) + 0x2b) = 0;
      }
      *(uint *)(in_RSI + 0x3c) = *(byte *)(in_RSI + 0x38) & 0xf;
    }
  }
  else {
    *(int *)(in_RSI + 0x3c) = *(int *)(in_RSI + 0x3c) + -1;
    if (*(int *)(in_RSI + 0x3c) < 1) {
      if (*(long *)(in_RSI + 0x88) == 0) {
        if ((*(uint *)(*in_RDI + 100) & 0x40) != 0) {
          it_retrigger_note(in_stack_00000050,in_stack_00000048);
        }
      }
      else {
        it_playing_reset_resamplers(unaff_retaddr,pos);
        *(undefined1 *)(*(long *)(in_RSI + 0x88) + 0x2b) = 0;
      }
      *(uint *)(in_RSI + 0x3c) = (uint)*(byte *)(in_RSI + 0x39);
    }
  }
  return;
}

Assistant:

static void update_retrig(DUMB_IT_SIGRENDERER *sigrenderer, IT_CHANNEL *channel)
{
	if (channel->xm_retrig) {
		channel->retrig_tick--;
		if (channel->retrig_tick <= 0) {
			if (channel->playing) {
				it_playing_reset_resamplers(channel->playing, 0);
				channel->playing->declick_stage = 0;
			} else if (sigrenderer->sigdata->flags & IT_WAS_AN_XM) it_retrigger_note(sigrenderer, channel);
			channel->retrig_tick = channel->xm_retrig;
		}
	} else if (channel->retrig & 0x0F) {
		channel->retrig_tick--;
		if (channel->retrig_tick <= 0) {
			if (channel->retrig < 0x10) {
			} else if (channel->retrig < 0x20) {
				channel->volume--;
				if (channel->volume > 64) channel->volume = 0;
			} else if (channel->retrig < 0x30) {
				channel->volume -= 2;
				if (channel->volume > 64) channel->volume = 0;
			} else if (channel->retrig < 0x40) {
				channel->volume -= 4;
				if (channel->volume > 64) channel->volume = 0;
			} else if (channel->retrig < 0x50) {
				channel->volume -= 8;
				if (channel->volume > 64) channel->volume = 0;
			} else if (channel->retrig < 0x60) {
				channel->volume -= 16;
				if (channel->volume > 64) channel->volume = 0;
			} else if (channel->retrig < 0x70) {
				channel->volume <<= 1;
				channel->volume /= 3;
			} else if (channel->retrig < 0x80) {
				channel->volume >>= 1;
			} else if (channel->retrig < 0x90) {
			} else if (channel->retrig < 0xA0) {
				channel->volume++;
				if (channel->volume > 64) channel->volume = 64;
			} else if (channel->retrig < 0xB0) {
				channel->volume += 2;
				if (channel->volume > 64) channel->volume = 64;
			} else if (channel->retrig < 0xC0) {
				channel->volume += 4;
				if (channel->volume > 64) channel->volume = 64;
			} else if (channel->retrig < 0xD0) {
				channel->volume += 8;
				if (channel->volume > 64) channel->volume = 64;
			} else if (channel->retrig < 0xE0) {
				channel->volume += 16;
				if (channel->volume > 64) channel->volume = 64;
			} else if (channel->retrig < 0xF0) {
				channel->volume *= 3;
				channel->volume >>= 1;
				if (channel->volume > 64) channel->volume = 64;
			} else {
				channel->volume <<= 1;
				if (channel->volume > 64) channel->volume = 64;
			}
			if (channel->playing) {
				it_playing_reset_resamplers(channel->playing, 0);
				channel->playing->declick_stage = 0;
			} else if (sigrenderer->sigdata->flags & IT_WAS_AN_XM) it_retrigger_note(sigrenderer, channel);
			channel->retrig_tick = channel->retrig & 0x0F;
		}
	}
}